

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_dispatch.c
# Opt level: O3

void setptmode(global_State *g,GCproto *pt,int mode)

{
  ushort uVar1;
  
  if (((uint)mode >> 8 & 1) != 0) {
    pt->flags = pt->flags & 0xf7;
    lj_trace_reenableproto(pt);
    return;
  }
  if (((uint)mode >> 9 & 1) != 0) {
    uVar1 = pt->trace;
    if (uVar1 != 0) {
      do {
        trace_flushroot((jit_State *)(g + 1),
                        *(GCtrace **)(g[1].ctype_state.ptr64 + (ulong)uVar1 * 8));
        uVar1 = pt->trace;
      } while (uVar1 != 0);
    }
    return;
  }
  pt->flags = pt->flags | 8;
  lj_trace_flushproto(g,pt);
  return;
}

Assistant:

static void setptmode(global_State *g, GCproto *pt, int mode)
{
  if ((mode & LUAJIT_MODE_ON)) {  /* (Re-)enable JIT compilation. */
    pt->flags &= ~PROTO_NOJIT;
    lj_trace_reenableproto(pt);  /* Unpatch all ILOOP etc. bytecodes. */
  } else {  /* Flush and/or disable JIT compilation. */
    if (!(mode & LUAJIT_MODE_FLUSH))
      pt->flags |= PROTO_NOJIT;
    lj_trace_flushproto(g, pt);  /* Flush all traces of prototype. */
  }
}